

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall
notch::core::FixedRate::deltaRuleWithMomentum
          (FixedRate *this,Array *var,Array *lastDelta,Array *grad)

{
  float fVar1;
  size_t sVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  
  sVar2 = var->_M_size;
  if (lastDelta->_M_size != sVar2) {
    operator_delete(lastDelta->_M_data);
    lastDelta->_M_size = sVar2;
    pfVar5 = (float *)operator_new(sVar2 * 4);
    lastDelta->_M_data = pfVar5;
    if (sVar2 != 0) {
      memset(pfVar5,0,sVar2 * 4);
    }
  }
  pfVar3 = lastDelta->_M_data;
  pfVar5 = pfVar3 + lastDelta->_M_size;
  if (lastDelta->_M_size == 0) {
    pfVar5 = (float *)0x0;
    pfVar3 = (float *)0x0;
  }
  internal::scale<float*>(this->momentum,pfVar3,pfVar5,pfVar3,pfVar5);
  pfVar3 = grad->_M_data;
  pfVar5 = pfVar3 + grad->_M_size;
  if (grad->_M_size == 0) {
    pfVar5 = (float *)0x0;
    pfVar3 = (float *)0x0;
  }
  pfVar4 = lastDelta->_M_data;
  pfVar6 = pfVar4 + lastDelta->_M_size;
  if (lastDelta->_M_size == 0) {
    pfVar6 = (float *)0x0;
    pfVar4 = (float *)0x0;
  }
  internal::scaleAdd<float_const*,float*>(-this->learningRate,pfVar3,pfVar5,pfVar4,pfVar6);
  fVar1 = this->weightDecay;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    pfVar3 = var->_M_data;
    pfVar5 = pfVar3 + var->_M_size;
    if (var->_M_size == 0) {
      pfVar5 = (float *)0x0;
      pfVar3 = (float *)0x0;
    }
    pfVar4 = lastDelta->_M_data;
    pfVar6 = pfVar4 + lastDelta->_M_size;
    if (lastDelta->_M_size == 0) {
      pfVar6 = (float *)0x0;
      pfVar4 = (float *)0x0;
    }
    internal::scaleAdd<float*,float*>(fVar1 * this->learningRate * -2.0,pfVar3,pfVar5,pfVar4,pfVar6)
    ;
  }
  pfVar3 = lastDelta->_M_data;
  pfVar5 = pfVar3 + lastDelta->_M_size;
  if (lastDelta->_M_size == 0) {
    pfVar5 = (float *)0x0;
    pfVar3 = (float *)0x0;
  }
  pfVar4 = var->_M_data;
  pfVar6 = pfVar4 + var->_M_size;
  if (var->_M_size == 0) {
    pfVar6 = (float *)0x0;
    pfVar4 = (float *)0x0;
  }
  internal::scaleAdd<float*,float*>(1.0,pfVar3,pfVar5,pfVar4,pfVar6);
  return;
}

Assistant:

void deltaRuleWithMomentum(Array &var, Array &lastDelta, const Array &grad) {
        size_t n = var.size();
        if (lastDelta.size() != n) {
            lastDelta.resize(n, 0.0f);
        }
        // calculate updates: delta = momentum * delta - eta * grad
        //   lastDelta = momentum * lastDelta
        internal::scale(momentum,
                std::begin(lastDelta), std::end(lastDelta),
                std::begin(lastDelta), std::end(lastDelta));
        //   lastDelta = lastDelta - eta * grad
        internal::scaleAdd(-learningRate,
                std::begin(grad), std::end(grad),
                std::begin(lastDelta), std::end(lastDelta));
        // add weight decay: var = var - 2 * eta * lambda * var
        //   lastDelta = lastDelta - 2 * eta * lambda * var
        if (weightDecay != 0) {
            internal::scaleAdd(- 2 * learningRate * weightDecay,
                std::begin(var), std::end(var),
                std::begin(lastDelta), std::end(lastDelta));
        }
        // update weights
        internal::scaleAdd(1.0,
                std::begin(lastDelta), std::end(lastDelta),
                std::begin(var), std::end(var));
    }